

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O1

int do_play_instrument(obj *instr)

{
  byte bVar1;
  short sVar2;
  monst *pmVar3;
  char cVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  trap *ptVar11;
  obj *obj;
  ulong uVar12;
  int tmp;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  int iVar20;
  monst *pmVar21;
  long lVar22;
  long lVar23;
  schar dz;
  schar dy;
  boolean matched [5];
  char buf [256];
  uint local_17c;
  uint local_178;
  char local_174 [8];
  int local_16c;
  long local_168;
  ulong local_160;
  d_level *local_158;
  long local_150;
  long local_148;
  long local_140;
  char local_138 [264];
  
  if ((u._1052_1_ & 2) != 0) {
    pline("You can\'t play music underwater!");
    return 0;
  }
  if (((instr->otyp & 0xfffeU) != 0x106) &&
     (cVar4 = yn_function("Improvise?","yn",'n'), cVar4 == 'n')) {
    if ((((uint)u.uevent & 0xc0) == 0x80) &&
       (cVar4 = yn_function("Play the passtune?","yn",'n'), cVar4 == 'y')) {
      strcpy(local_138,tune);
    }
    else {
      getlin("What tune are you playing? [5 notes, A-G]",local_138);
      mungspaces(local_138);
      if (local_138[0] != '\0') {
        pcVar9 = local_138;
        do {
          pcVar9 = pcVar9 + 1;
          cVar4 = highc(local_138[0]);
          if (cVar4 == 'H') {
            cVar4 = 'B';
          }
          pcVar9[-1] = cVar4;
          local_138[0] = *pcVar9;
        } while (local_138[0] != '\0');
      }
    }
    pcVar9 = xname(instr);
    pcVar9 = the(pcVar9);
    pline("You extract a strange sound from %s!",pcVar9);
    bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar5 == '\0') {
      return 1;
    }
    exercise(2,'\x01');
    iVar7 = strcmp(local_138,tune);
    if (iVar7 == 0) {
      local_17c = (int)u.uy - 1;
      if (u.uy + 1 < (int)local_17c) {
        return 1;
      }
      do {
        iVar7 = (int)u.ux;
        if ((int)(iVar7 - 1U) <= iVar7 + 1) {
          uVar13 = iVar7 - 2;
          local_178 = iVar7 - 1U;
          do {
            if (((uVar13 < 0x4f) && (local_17c < 0x15)) &&
               (bVar5 = find_drawbridge((int *)&local_178,(int *)&local_17c), bVar5 != '\0')) {
              u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
              if (level->locations[(int)local_178][(int)local_17c].typ != '$') {
                open_drawbridge(local_178,local_17c);
                return 1;
              }
              close_drawbridge(local_178,local_17c);
              return 1;
            }
            bVar19 = (int)local_178 <= (int)u.ux;
            uVar13 = local_178;
            local_178 = local_178 + 1;
          } while (bVar19);
        }
        bVar19 = (int)u.uy < (int)local_17c;
        local_17c = local_17c + 1;
        if (bVar19) {
          return 1;
        }
      } while( true );
    }
    if (flags.soundok == '\0') {
      return 1;
    }
    if (((uint)u.uevent & 0xc0) == 0) {
      u.uevent = (u_event)((uint)u.uevent | 0x40);
    }
    local_17c = (int)u.uy - 1;
    if (u.uy + 1 < (int)local_17c) {
      return 1;
    }
    bVar19 = false;
    do {
      uVar13 = (int)u.ux - 1;
      if ((int)uVar13 <= u.ux + 1) {
        do {
          local_178 = uVar13;
          if ((local_17c < 0x15 && uVar13 - 1 < 0x4f) &&
             (((cVar4 = level->locations[uVar13][local_17c].typ, cVar4 == '\x14' || (cVar4 == '$'))
              || (iVar7 = is_drawbridge_wall(uVar13,local_17c), -1 < iVar7)))) {
            bVar19 = true;
          }
          uVar13 = local_178 + 1;
        } while (((int)local_178 <= (int)u.ux) && (!bVar19));
      }
      uVar13 = local_17c + 1;
    } while (((int)local_17c <= (int)u.uy) && (local_17c = uVar13, !bVar19));
    if (!bVar19) {
      return 1;
    }
    local_174[4] = 0;
    local_174[0] = '\0';
    local_174[1] = '\0';
    local_174[2] = '\0';
    local_174[3] = '\0';
    local_178 = 5;
    local_17c = uVar13;
    sVar10 = strlen(local_138);
    if ((int)(uint)sVar10 < 1) {
      uVar12 = 0;
      uVar14 = 0;
      uVar13 = 0;
    }
    else {
      uVar12 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if (uVar12 < 5) {
          if (local_138[uVar12] == tune[uVar12]) {
            uVar13 = uVar13 + 1;
            uVar16 = uVar12;
LAB_001fd18b:
            local_174[uVar16] = '\x01';
          }
          else {
            uVar16 = 0;
            do {
              if (((local_174[uVar16] == '\0') && (local_138[uVar12] == tune[uVar16])) &&
                 (local_138[uVar16] != tune[uVar16])) {
                uVar14 = (ulong)((int)uVar14 + 1);
                local_17c = (uint)uVar16;
                goto LAB_001fd18b;
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != 5);
            local_17c = 5;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != ((uint)sVar10 & 0x7fffffff));
    }
    local_178 = (uint)uVar12;
    if ((int)uVar14 != 0) {
      pcVar18 = "s";
      pcVar9 = "s";
      if ((int)uVar14 == 1) {
        pcVar9 = "";
      }
      if (uVar13 == 0) {
        You_hear("%d tumbler%s click.",uVar14,pcVar9);
        return 1;
      }
      if (uVar13 == 1) {
        pcVar18 = "";
      }
      You_hear("%d tumbler%s click and %d gear%s turn.",uVar14,pcVar9,(ulong)uVar13,pcVar18);
      return 1;
    }
    if (uVar13 == 0) {
      return 1;
    }
    pcVar9 = "s";
    if (uVar13 == 1) {
      pcVar9 = "";
    }
    You_hear("%d gear%s turn.",(ulong)uVar13,pcVar9);
    if (uVar13 == 5) {
      u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
      return 1;
    }
    return 1;
  }
  uVar13 = u.uprops[0x1c].intrinsic;
  if (u.uprops[0x1c].intrinsic == 0) {
    pcVar9 = xname(instr);
    the(pcVar9);
    pline("You start playing %s.");
  }
  else {
    pline("What you produce is quite far from music...");
  }
  switch(instr->otyp) {
  case 0xfd:
    if ((uVar13 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar9 = "soft";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar9 = "elevator";
        }
        else {
          bVar5 = dmgtype(youmonst.data,0x24);
          pcVar9 = "soft";
          if (bVar5 == '\0') {
            pcVar9 = "elevator";
          }
        }
      }
      pline("You produce %s music.",pcVar9);
      iVar7 = u.ulevel;
      pmVar21 = level->monlist;
      if (pmVar21 != (monst *)0x0) {
        iVar8 = u.ulevel * 5;
        do {
          if ((0 < pmVar21->mhp) &&
             (iVar15 = dist2((int)pmVar21->mx,(int)pmVar21->my,(int)u.ux,(int)u.uy),
             SBORROW4(iVar15,iVar8) != iVar15 + iVar7 * -5 < 0)) {
            iVar15 = 10;
            iVar20 = -10;
            do {
              uVar13 = mt_random();
              iVar15 = iVar15 + uVar13 % 10;
              iVar20 = iVar20 + 1;
            } while (iVar20 != 0);
            iVar15 = sleep_monst(pmVar21,iVar15,6);
            if (iVar15 != 0) {
              pmVar21->field_0x62 = pmVar21->field_0x62 | 8;
              slept_monst(pmVar21);
            }
          }
          pmVar21 = pmVar21->nmon;
        } while (pmVar21 != (monst *)0x0);
      }
      exercise(3,'\x01');
      iVar7 = 0xfd;
LAB_001fe4fb:
      makeknown_msg(iVar7);
      return 2;
    }
  case 0xfc:
    sVar6 = acurr(3);
    uVar17 = mt_random();
    bVar19 = 0x19 < SUB164(ZEXT416(uVar17) % SEXT816((long)sVar6),0) + u.ulevel;
    pcVar9 = "toot";
    if (uVar13 == 0 && bVar19) {
      pcVar9 = "trill";
    }
    pcVar9 = Tobjnam(instr,pcVar9);
    pline("%s.",pcVar9);
    iVar7 = u.ulevel;
    if ((uVar13 == 0 && bVar19) && (pmVar21 = level->monlist, pmVar21 != (monst *)0x0)) {
      iVar8 = u.ulevel * 3;
      do {
        if ((((0 < pmVar21->mhp) && (pmVar21->data->mlet == '-')) &&
            ((pmVar21->field_0x62 & 4) != 0)) &&
           (iVar15 = dist2((int)pmVar21->mx,(int)pmVar21->my,(int)u.ux,(int)u.uy),
           SBORROW4(iVar15,iVar8) != iVar15 + iVar7 * -3 < 0)) {
          uVar13 = *(uint *)&pmVar21->field_0x60;
          *(uint *)&pmVar21->field_0x60 = uVar13 & 0xffbf7fff | 0x400000;
          if (pmVar21->wormno == '\0') {
            if ((viz_array[pmVar21->my][pmVar21->mx] & 2U) != 0) goto LAB_001fd60f;
            if (((((u.uprops[0x1e].intrinsic != 0) ||
                  ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
               ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_001fd678;
            bVar19 = false;
            if (((viz_array[pmVar21->my][pmVar21->mx] & 1U) != 0) &&
               ((pmVar21->data->mflags3 & 0x200) != 0)) goto LAB_001fd60f;
          }
          else {
            bVar5 = worm_known(level,pmVar21);
            if (bVar5 == '\0') {
LAB_001fd678:
              bVar19 = false;
            }
            else {
LAB_001fd60f:
              uVar17 = *(uint *)&pmVar21->field_0x60;
              if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar17 < '\0') goto LAB_001fd678;
              }
              else {
                bVar19 = false;
                if (((char)uVar17 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_001fd67b;
              }
              bVar19 = (u._1052_1_ & 0x20) == 0 && (uVar17 >> 9 & 1) == 0;
            }
          }
LAB_001fd67b:
          pmVar21->field_0x60 = pmVar21->field_0x60 & 0x7f;
          newsym((int)pmVar21->mx,(int)pmVar21->my);
          if (pmVar21->wormno == '\0') {
            if (((viz_array[pmVar21->my][pmVar21->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 (((viz_array[pmVar21->my][pmVar21->mx] & 1U) != 0 &&
                  ((pmVar21->data->mflags3 & 0x200) != 0)))))))) goto LAB_001fd762;
          }
          else {
            bVar5 = worm_known(level,pmVar21);
            if (bVar5 != '\0') {
LAB_001fd762:
              uVar17 = *(uint *)&pmVar21->field_0x60;
              if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar17 & 0x280) == 0) goto LAB_001fd7b0;
              }
              else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001fd7b0:
                if ((u._1052_1_ & 0x20) == 0) {
                  if (bVar19) {
                    pcVar9 = Monnam(pmVar21);
                    pcVar18 = "";
                    if ((uVar13 >> 0x16 & 1) == 0) {
                      pcVar18 = ", and now seems quieter";
                    }
                    pline("%s freezes, then sways with the music%s.",pcVar9,pcVar18);
                  }
                  else {
                    pcVar9 = a_monnam(pmVar21);
                    pline("You notice %s, swaying with the music.",pcVar9);
                  }
                }
              }
            }
          }
        }
        pmVar21 = pmVar21->nmon;
      } while (pmVar21 != (monst *)0x0);
    }
    break;
  case 0xff:
  case 0x100:
    if ((uVar13 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      iVar7 = getdir((char *)0x0,local_174,(schar *)&local_178,(schar *)&local_17c);
      if (iVar7 == 0) {
        pcVar9 = Tobjnam(instr,"vibrate");
        pline("%s.",pcVar9);
        return 2;
      }
      if (((local_174[0] == '\0') && ((char)local_178 == '\0')) && ((char)local_17c == '\0')) {
        iVar7 = zapyourself(instr,'\x01');
        if (iVar7 != 0) {
          sprintf(local_138,"using a magical horn on %sself",
                  *(undefined8 *)
                   ((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
          losehp(iVar7,local_138,1);
        }
      }
      else {
        sVar2 = instr->otyp;
        uVar13 = mt_random();
        buzz((sVar2 == 0xff) + 1,uVar13 % 6 + 6,u.ux,u.uy,(int)local_174[0],(int)(char)local_178);
      }
      iVar7 = (int)instr->otyp;
      goto LAB_001fe4fb;
    }
  case 0xfe:
    pline("You produce a frightful, grave sound.");
    iVar7 = u.ulevel * 0x1e;
LAB_001fd84d:
    awaken_monsters(iVar7);
LAB_001fd852:
    exercise(2,'\0');
    return 2;
  default:
    warning("What a weird instrument (%d)!",(ulong)(uint)(int)instr->otyp);
    return 2;
  case 0x103:
    if ((uVar13 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar9 = Tobjnam(instr,"produce");
      pline("%s very attractive music.",pcVar9);
      if ((u._1052_1_ & 1) == 0) {
        if (level->monlist != (monst *)0x0) {
          iVar7 = u.ulevel + -1;
          pmVar21 = level->monlist;
          do {
            pmVar3 = pmVar21->nmon;
            if (((0 < pmVar21->mhp) &&
                (iVar8 = dist2((int)pmVar21->mx,(int)pmVar21->my,(int)u.ux,(int)u.uy),
                iVar8 <= iVar7 / 3 + 1)) && (iVar8 = resist(pmVar21,'\x06',0,0), iVar8 == 0)) {
              tamedog(pmVar21,(obj *)0x0);
            }
            pmVar21 = pmVar3;
          } while (pmVar3 != (monst *)0x0);
        }
      }
      else {
        iVar7 = resist(u.ustuck,'\x06',0,0);
        if (iVar7 == 0) {
          tamedog(u.ustuck,(obj *)0x0);
        }
      }
      exercise(3,'\x01');
      iVar7 = 0x103;
      goto LAB_001fe4fb;
    }
  case 0x102:
    sVar6 = acurr(3);
    uVar17 = mt_random();
    bVar19 = 0x19 < SUB164(ZEXT416(uVar17) % SEXT816((long)sVar6),0) + u.ulevel;
    pcVar9 = xname(instr);
    pcVar9 = The(pcVar9);
    pcVar18 = "twangs";
    if (uVar13 == 0 && bVar19) {
      pcVar18 = "produces a lilting melody";
    }
    pline("%s %s.",pcVar9,pcVar18);
    iVar7 = u.ulevel;
    if ((uVar13 == 0 && bVar19) && (pmVar21 = level->monlist, pmVar21 != (monst *)0x0)) {
      iVar8 = u.ulevel * 3;
      do {
        if (((0 < pmVar21->mhp) && (pmVar21->data->mlet == '\x0e')) &&
           (((pmVar21->field_0x62 & 4) != 0 &&
            (iVar15 = dist2((int)pmVar21->mx,(int)pmVar21->my,(int)u.ux,(int)u.uy),
            SBORROW4(iVar15,iVar8) != iVar15 + iVar7 * -3 < 0)))) {
          *(uint *)&pmVar21->field_0x60 = *(uint *)&pmVar21->field_0x60 & 0xffb77fff | 0x400000;
          if (pmVar21->wormno == '\0') {
            if (((viz_array[pmVar21->my][pmVar21->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                (((viz_array[pmVar21->my][pmVar21->mx] & 1U) != 0 &&
                 ((pmVar21->data->mflags3 & 0x200) != 0)))))) goto LAB_001fd38d;
          }
          else {
            bVar5 = worm_known(level,pmVar21);
            if (bVar5 != '\0') {
LAB_001fd38d:
              uVar13 = *(uint *)&pmVar21->field_0x60;
              if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar13 & 0x280) == 0) goto LAB_001fd3d4;
              }
              else if (((uVar13 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001fd3d4:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar9 = Monnam(pmVar21);
                  pline("%s listens cheerfully to the music, then seems quieter.",pcVar9);
                }
              }
            }
          }
        }
        pmVar21 = pmVar21->nmon;
      } while (pmVar21 != (monst *)0x0);
    }
    break;
  case 0x105:
    pcVar9 = xname(instr);
    the(pcVar9);
    pline("You extract a loud noise from %s.");
    awaken_soldiers();
    goto LAB_001fd852;
  case 0x106:
    goto switchD_001fcf7f_caseD_106;
  case 0x107:
    if ((uVar13 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pline("You produce a heavy, thunderous rolling!");
      pcVar9 = get_generic_level_description(level);
      pline("The entire %s is shaking around you!",pcVar9);
      iVar8 = (u.ulevel + -1) / 3;
      iVar7 = iVar8 * 2 + 2;
      iVar15 = (int)u.ux + iVar8 * 2 + 2;
      uVar13 = u.ux - iVar7;
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      iVar20 = 0x4f;
      if (iVar15 < 0x4f) {
        iVar20 = iVar15;
      }
      if ((int)uVar13 <= iVar20) {
        iVar15 = iVar7 + u.uy;
        local_16c = 0x14;
        if (iVar15 < 0x14) {
          local_16c = iVar15;
        }
        uVar17 = u.uy - iVar7;
        if ((int)uVar17 < 2) {
          uVar17 = 1;
        }
        local_160 = (ulong)uVar17;
        local_140 = (long)(0xd - iVar8);
        local_148 = (long)local_16c;
        uVar12 = (ulong)uVar13;
        local_150 = (long)iVar20;
        lVar22 = uVar12 * 0xa8 + 0x8380;
        local_168 = uVar12 * 0xfc + local_160 * 0xc + 0x46;
        local_158 = &dungeon_topology.d_astral_level;
        do {
          uVar14 = local_160;
          lVar23 = local_168;
          if ((int)local_160 <= local_16c) {
            do {
              pmVar21 = *(monst **)(level->levname + uVar14 * 8 + lVar22);
              if (pmVar21 == (monst *)0x0) {
                pmVar21 = (monst *)0x0;
              }
              else if ((pmVar21->field_0x61 & 2) != 0) {
                pmVar21 = (monst *)0x0;
              }
              iVar7 = (int)uVar12;
              iVar8 = (int)uVar14;
              if (pmVar21 != (monst *)0x0) {
                wakeup(pmVar21);
                if (((char)*(uint *)&pmVar21->field_0x60 < '\0') &&
                   ((pmVar21->data->mflags1 & 0x100) != 0)) {
                  *(uint *)&pmVar21->field_0x60 = *(uint *)&pmVar21->field_0x60 & 0xffffff7f;
                  if ((viz_array[uVar14][uVar12] & 2U) == 0) {
                    You_hear("a thumping sound.");
                  }
                  else {
                    pcVar9 = Amonnam(pmVar21);
                    pline("%s is shaken loose from the ceiling!",pcVar9);
                  }
                  if ((uVar12 == (uint)(int)u.ux) && (uVar14 == (uint)(int)u.uy)) {
                    pcVar9 = mon_nam(pmVar21);
                    pline("You easily dodge the falling %s.",pcVar9);
                  }
                  newsym(iVar7,iVar8);
                }
              }
              uVar13 = mt_random();
              if (SUB168(ZEXT416(uVar13) % SEXT816(local_140),0) != 0)
              goto switchD_001fde72_caseD_1a;
              switch(level->levname[lVar23 + -2]) {
              case '\x17':
                if ((*(ushort *)(level->levname + lVar23) & 0x1f0) == 0)
                goto switchD_001fde72_caseD_18;
                iVar15 = artifact_door(level,iVar7,iVar8);
                if (iVar15 != 0) goto switchD_001fde72_caseD_1a;
                if ((viz_array[uVar14][uVar12] & 2U) != 0) {
                  pline("The door collapses.");
                }
                pcVar9 = in_rooms(level,(xchar)uVar12,(xchar)uVar14,0x12);
                if (*pcVar9 != '\0') {
                  add_damage((xchar)uVar12,(xchar)uVar14,0);
                }
                *(uint *)(level->levname + lVar23) = *(uint *)(level->levname + lVar23) & 0xfffffe0f
                ;
                unblock_point(iVar7,iVar8);
                goto LAB_001fe1a5;
              case '\x18':
              case '\x19':
                goto switchD_001fde72_caseD_18;
              default:
                goto switchD_001fde72_caseD_1a;
              case '\x1c':
                pcVar9 = "The fountain falls into a chasm.";
                if ((viz_array[uVar14][uVar12] & 2U) == 0) goto switchD_001fde72_caseD_18;
                goto LAB_001fdf1a;
              case '\x1d':
                bVar1 = viz_array[uVar14][uVar12];
                pcVar9 = "The throne falls into a chasm.";
                break;
              case '\x1f':
                bVar1 = viz_array[uVar14][uVar12];
                pcVar9 = "The kitchen sink falls into a chasm.";
                break;
              case ' ':
                bVar1 = viz_array[uVar14][uVar12];
                pcVar9 = "The headstone topples into a chasm.";
                break;
              case '!':
                bVar5 = on_level(&u.uz,local_158);
                if ((bVar5 == '\0') &&
                   (bVar5 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar5 == '\0')) {
                  bVar1 = viz_array[uVar14][uVar12];
                  pcVar9 = "The altar falls into a chasm.";
                  break;
                }
                goto switchD_001fde72_caseD_1a;
              }
              if ((bVar1 & 2) != 0) {
LAB_001fdf1a:
                pline(pcVar9);
              }
switchD_001fde72_caseD_18:
              ptVar11 = maketrap(level,iVar7,iVar8,0xb);
              if (ptVar11 != (trap *)0x0) {
                ptVar11->field_0x8 = ptVar11->field_0x8 | 0x20;
                *(uint *)(level->levname + lVar23) = *(uint *)(level->levname + lVar23) & 0xfffffe0f
                ;
                pmVar21 = *(monst **)(level->levname + uVar14 * 8 + lVar22);
                if (pmVar21 == (monst *)0x0) {
                  pmVar21 = (monst *)0x0;
                }
                else if ((pmVar21->field_0x61 & 2) != 0) {
                  pmVar21 = (monst *)0x0;
                }
                obj = sobj_at(0x214,level,iVar7,iVar8);
                if (obj == (obj *)0x0) {
                  if (pmVar21 == (monst *)0x0) {
                    if (((u.utrap == 0) && (uVar12 == (uint)(int)u.ux)) &&
                       (uVar14 == (uint)(int)u.uy)) {
                      if (((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
                          ((youmonst.data)->mlet != '\x05')) &&
                         ((u.uprops[0x3c].extrinsic == 0 &&
                          (uVar13 = (youmonst.data)->mflags1, (uVar13 & 1) == 0)))) {
                        if (u.usteed == (monst *)0x0) {
                          if ((uVar13 & 0x10) == 0) goto LAB_001fe2ee;
                        }
                        else if ((uVar13 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_001fe2ee:
                          pline("You fall into a chasm!");
                          uVar13 = mt_random();
                          u.utrap = uVar13 % 6 + 2;
                          u.utraptype = 1;
                          uVar13 = mt_random();
                          losehp(uVar13 % 6 + 1,"fell into a chasm",2);
                          selftouch("Falling, you");
                          goto switchD_001fde72_caseD_1a;
                        }
                      }
                      pline("A chasm opens up under you!");
                      pline("You don\'t fall in!");
                    }
                    else {
LAB_001fe1a5:
                      newsym(iVar7,iVar8);
                    }
                  }
                  else if ((pmVar21->data->mflags1 & 0x11) == 0) {
                    pmVar21->field_0x62 = pmVar21->field_0x62 | 0x80;
                    if ((viz_array[uVar14][uVar12] & 2U) == 0) {
                      if ((flags.soundok != '\0') && ((pmVar21->data->mflags1 & 0x20000) != 0)) {
                        You_hear("a scream!");
                      }
                    }
                    else {
                      pcVar9 = Monnam(pmVar21);
                      pline("%s falls into a chasm!",pcVar9);
                    }
                    mselftouch(pmVar21,"Falling, ",'\x01');
                    if (0 < pmVar21->mhp) {
                      uVar13 = mt_random();
                      iVar7 = ~(uVar13 % 6) + pmVar21->mhp;
                      pmVar21->mhp = iVar7;
                      if (iVar7 < 1) {
                        if ((viz_array[uVar14][uVar12] & 2U) == 0) {
                          pline("It is destroyed!");
                        }
                        else {
                          if (pmVar21->mtame == '\0') {
                            mon_nam(pmVar21);
                          }
                          else {
                            x_monnam(pmVar21,1,"poor",(uint)(pmVar21->mnamelth != '\0') << 3,'\0');
                          }
                          pline("You destroy %s!");
                        }
                        xkilled(pmVar21,0);
                      }
                    }
                  }
                }
                else {
                  if ((viz_array[uVar14][uVar12] & 2U) != 0) {
                    pcVar9 = "";
                    if ((uint)(int)u.uy == uVar14 && (uint)(int)u.ux == uVar12) {
                      pcVar9 = " below you";
                    }
                    pline("KADOOM! The boulder falls into a chasm%s!",pcVar9);
                  }
                  if (pmVar21 != (monst *)0x0) {
                    pmVar21->field_0x62 = pmVar21->field_0x62 & 0x7f;
                  }
                  obj_extract_self(obj);
                  flooreffects(obj,iVar7,iVar8,"");
                }
              }
switchD_001fde72_caseD_1a:
              bVar19 = (long)uVar14 < local_148;
              uVar14 = uVar14 + 1;
              lVar23 = lVar23 + 0xc;
            } while (bVar19);
          }
          lVar22 = lVar22 + 0xa8;
          local_168 = local_168 + 0xfc;
          bVar19 = (long)uVar12 < local_150;
          uVar12 = uVar12 + 1;
        } while (bVar19);
      }
      awaken_monsters(0x690);
      iVar7 = 0x107;
      goto LAB_001fe4fb;
    }
    goto switchD_001fcf7f_caseD_106;
  }
  exercise(3,'\x01');
  return 2;
switchD_001fcf7f_caseD_106:
  pline("You beat a deafening row!");
  iVar7 = u.ulevel * 0x28;
  goto LAB_001fd84d;
}

Assistant:

int do_play_instrument(struct obj *instr)
{
    char buf[BUFSZ], c = 'y';
    char *s;
    int x,y;
    boolean ok;

    if (Underwater) {
	pline("You can't play music underwater!");
	return 0;
    }
    if (instr->otyp != LEATHER_DRUM && instr->otyp != DRUM_OF_EARTHQUAKE) {
	c = yn("Improvise?");
    }
    if (c == 'n') {
	if (u.uevent.uheard_tune == 2 && yn("Play the passtune?") == 'y') {
	    strcpy(buf, tune);
	} else {
	    getlin("What tune are you playing? [5 notes, A-G]", buf);
	    mungspaces(buf);
	    /* convert to uppercase and change any "H" to the expected "B" */
	    for (s = buf; *s; s++) {
		*s = highc(*s);
		if (*s == 'H') *s = 'B';
	    }
	}
	pline("You extract a strange sound from %s!", the(xname(instr)));
	
	/* Check if there was the Stronghold drawbridge near
	 * and if the tune conforms to what we're waiting for.
	 */
	if (Is_stronghold(&u.uz)) {
	    exercise(A_WIS, TRUE);		/* just for trying */
	    if (!strcmp(buf,tune)) {
		/* Search for the drawbridge */
		for (y=u.uy-1; y<=u.uy+1; y++)
		    for (x=u.ux-1;x<=u.ux+1;x++)
			if (isok(x,y))
			if (find_drawbridge(&x,&y)) {
			    u.uevent.uheard_tune = 2; /* tune now fully known */
			    if (level->locations[x][y].typ == DRAWBRIDGE_DOWN)
				close_drawbridge(x,y);
			    else
				open_drawbridge(x,y);
			    return 1;
			}
	    } else if (flags.soundok) {
		if (u.uevent.uheard_tune < 1) u.uevent.uheard_tune = 1;
		/* Okay, it wasn't the right tune, but perhaps
		 * we can give the player some hints like in the
		 * Mastermind game */
		ok = FALSE;
		for (y = u.uy-1; y <= u.uy+1 && !ok; y++)
		    for (x = u.ux-1; x <= u.ux+1 && !ok; x++)
			if (isok(x,y))
			if (IS_DRAWBRIDGE(level->locations[x][y].typ) ||
			   is_drawbridge_wall(x,y) >= 0)
				ok = TRUE;
		if (ok) { /* There is a drawbridge near */
		    int tumblers, gears;
		    boolean matched[5];

		    tumblers = gears = 0;
		    for (x=0; x < 5; x++)
			matched[x] = FALSE;

		    for (x=0; x < (int)strlen(buf); x++)
			if (x < 5) {
			    if (buf[x] == tune[x]) {
				gears++;
				matched[x] = TRUE;
			    } else
				for (y=0; y < 5; y++)
				    if (!matched[y] &&
				       buf[x] == tune[y] &&
				       buf[y] != tune[y]) {
					tumblers++;
					matched[y] = TRUE;
					break;
				    }
			}
		    if (tumblers)
			if (gears)
			    You_hear("%d tumbler%s click and %d gear%s turn.",
				tumblers, plur(tumblers), gears, plur(gears));
			else
			    You_hear("%d tumbler%s click.",
				tumblers, plur(tumblers));
		    else if (gears) {
			You_hear("%d gear%s turn.", gears, plur(gears));
			/* could only get `gears == 5' by playing five
			   correct notes followed by excess; otherwise,
			   tune would have matched above */
			if (gears == 5) u.uevent.uheard_tune = 2;
		    }
		}
	    }
	  }
	return 1;
    } else
	    return do_improvisation(instr);
}